

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# content_encoding.c
# Opt level: O0

CURLcode Curl_unencode_deflate_write(connectdata *conn,SingleRequest *k,ssize_t nread)

{
  int iVar1;
  CURLcode CVar2;
  z_stream *z_00;
  z_stream *z;
  ssize_t nread_local;
  SingleRequest *k_local;
  connectdata *conn_local;
  
  z_00 = &k->z;
  if (k->zlib_init == ZLIB_UNINIT) {
    memset(z_00,0,0x70);
    (k->z).zalloc = zalloc_cb;
    (k->z).zfree = zfree_cb;
    iVar1 = inflateInit_(z_00,"1.2.11",0x70);
    if (iVar1 != 0) {
      CVar2 = process_zlib_error(conn,z_00);
      return CVar2;
    }
    k->zlib_init = ZLIB_INIT;
  }
  z_00->next_in = (Bytef *)k->str;
  (k->z).avail_in = (uInt)nread;
  CVar2 = inflate_stream(conn,k);
  return CVar2;
}

Assistant:

CURLcode
Curl_unencode_deflate_write(struct connectdata *conn,
                            struct SingleRequest *k,
                            ssize_t nread)
{
  z_stream *z = &k->z;          /* zlib state structure */

  /* Initialize zlib? */
  if(k->zlib_init == ZLIB_UNINIT) {
    memset(z, 0, sizeof(z_stream));
    z->zalloc = (alloc_func)zalloc_cb;
    z->zfree = (free_func)zfree_cb;

    if(inflateInit(z) != Z_OK)
      return process_zlib_error(conn, z);
    k->zlib_init = ZLIB_INIT;
  }

  /* Set the compressed input when this function is called */
  z->next_in = (Bytef *)k->str;
  z->avail_in = (uInt)nread;

  /* Now uncompress the data */
  return inflate_stream(conn, k);
}